

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

error_code __thiscall libtorrent::aux::torrent::initialize_merkle_trees(torrent *this)

{
  vector<aux::merkle_tree,_file_index_t> *this_00;
  torrent_info *this_01;
  bool bVar1;
  byte bVar2;
  int s;
  file_storage *this_02;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar3;
  int64_t iVar4;
  file_index_t index;
  long lVar5;
  long lVar6;
  span<const_char> piece_layer;
  error_code eVar7;
  int local_80;
  int local_7c;
  error_code local_78;
  merkle_tree local_68;
  
  bVar1 = info_hash_t::has_v2(&this->m_info_hash);
  if (bVar1) {
    this_01 = (this->super_torrent_hot_members).m_torrent_file.
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar2 = (this_01->m_flags).m_val >> 4;
    this_02 = torrent_info::orig_files(this_01);
    this_00 = &this->m_merkle_trees;
    s = file_storage::num_files(this_02);
    container_wrapper<libtorrent::aux::merkle_tree,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::merkle_tree,std::allocator<libtorrent::aux::merkle_tree>>>
    ::reserve<int,void>((container_wrapper<libtorrent::aux::merkle_tree,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::merkle_tree,std::allocator<libtorrent::aux::merkle_tree>>>
                         *)this_00,s);
    iVar3 = file_storage::file_range(this_02);
    lVar5 = (long)iVar3._begin.m_val.m_val * 0x30;
    lVar6 = ((long)iVar3 >> 0x20) - (long)iVar3._begin.m_val.m_val;
    while (bVar1 = lVar6 != 0, lVar6 = lVar6 + -1, bVar1) {
      index.m_val = (int)iVar3._begin.m_val;
      bVar1 = file_storage::pad_file_at(this_02,index);
      if (bVar1) {
LAB_002ce794:
        ::std::vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>::
        emplace_back<>(&this_00->
                        super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                      );
      }
      else {
        iVar4 = file_storage::file_size(this_02,index);
        if (iVar4 == 0) goto LAB_002ce794;
        local_7c = file_storage::file_num_blocks(this_02,index);
        local_80 = file_storage::blocks_per_piece(this_02);
        local_68.m_root = file_storage::root_ptr(this_02,index);
        ::std::vector<libtorrent::aux::merkle_tree,std::allocator<libtorrent::aux::merkle_tree>>::
        emplace_back<int,int,char_const*>
                  ((vector<libtorrent::aux::merkle_tree,std::allocator<libtorrent::aux::merkle_tree>>
                    *)this_00,&local_7c,&local_80,&local_68.m_root);
        piece_layer = torrent_info::piece_layer
                                ((this->super_torrent_hot_members).m_torrent_file.
                                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,index);
        if (piece_layer.m_len == 0) {
          bVar2 = 0;
        }
        else {
          bVar1 = merkle_tree::load_piece_layer
                            ((merkle_tree *)
                             ((long)&((this_00->
                                      super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                                      ).
                                      super__Vector_base<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_root + lVar5),
                             piece_layer);
          if (!bVar1) {
            local_68.m_block_verified.m_buf.
            super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
            super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
                 (unique_ptr<unsigned_int[],_long>)
                 (unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>)0x0;
            local_68.m_num_blocks = 0;
            local_68.m_blocks_per_piece_log = '\0';
            local_68.m_mode = uninitialized_tree;
            local_68._46_2_ = 0;
            local_68.m_tree.
            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_68.m_tree.
            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_68.m_root = (char *)0x0;
            local_68.m_tree.
            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            merkle_tree::operator=
                      ((merkle_tree *)
                       ((long)&((this->m_merkle_trees).
                                super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                                .
                                super__Vector_base<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_root + lVar5),
                       &local_68);
            merkle_tree::~merkle_tree(&local_68);
            this->field_0x5db = this->field_0x5db & 0xf7;
            boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                      (&local_78,torrent_invalid_piece_layer,(type *)0x0);
            goto LAB_002ce7ea;
          }
        }
      }
      lVar5 = lVar5 + 0x30;
      iVar3._begin.m_val = index.m_val + 1;
      iVar3._end.m_val = 0;
    }
    *(uint *)&this->field_0x5d8 =
         *(uint *)&this->field_0x5d8 & 0xf7ffffff | (uint)(bVar2 & 1) << 0x1b;
    torrent_info::free_piece_layers
              ((this->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  local_78.val_ = 0;
  local_78._4_4_ = local_78._4_4_ & 0xffffff00;
  local_78.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
LAB_002ce7ea:
  eVar7.failed_ = local_78.failed_;
  eVar7._5_3_ = local_78._5_3_;
  eVar7.val_ = local_78.val_;
  eVar7.cat_ = local_78.cat_;
  return eVar7;
}

Assistant:

error_code torrent::initialize_merkle_trees()
	{
		if (!info_hash().has_v2()) return {};

		bool valid = m_torrent_file->v2_piece_hashes_verified();

		file_storage const& fs = m_torrent_file->orig_files();
		m_merkle_trees.reserve(fs.num_files());
		for (file_index_t i : fs.file_range())
		{
			if (fs.pad_file_at(i) || fs.file_size(i) == 0)
			{
				m_merkle_trees.emplace_back();
				continue;
			}
			m_merkle_trees.emplace_back(fs.file_num_blocks(i)
				, fs.blocks_per_piece(), fs.root_ptr(i));
			auto const piece_layer = m_torrent_file->piece_layer(i);
			if (piece_layer.empty())
			{
				valid = false;
				continue;
			}

			if (!m_merkle_trees[i].load_piece_layer(piece_layer))
			{
				m_merkle_trees[i] = aux::merkle_tree();
				m_v2_piece_layers_validated = false;
				return errors::torrent_invalid_piece_layer;
			}
		}

		m_v2_piece_layers_validated = valid;

		m_torrent_file->free_piece_layers();
		return {};
	}